

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

_Bool do_curse_effect(wchar_t i,object *obj)

{
  effect *effect_00;
  _Bool aware;
  uint32_t uVar1;
  source sVar2;
  source origin;
  byte local_41;
  wchar_t local_30;
  _Bool local_29;
  wchar_t dir;
  _Bool was_aware;
  _Bool ident;
  effect *effect;
  curse *curse;
  object *obj_local;
  wchar_t i_local;
  
  effect = (effect *)(curses + i);
  _dir = (*(object **)&effect->y)->effect;
  local_29 = false;
  curse = (curse *)obj;
  obj_local._4_4_ = i;
  aware = player_knows_curse(player,i);
  uVar1 = Rand_div(8);
  local_30 = uVar1 + L'\x01';
  if (L'\x04' < local_30) {
    local_30 = uVar1 + L'\x02';
  }
  if (*(long *)(*(long *)&effect->y + 0x108) != 0) {
    msgt(0,"%s",*(undefined8 *)(*(long *)&effect->y + 0x108));
  }
  effect_00 = _dir;
  sVar2 = source_object((object *)curse);
  origin.which = sVar2.which;
  origin._4_4_ = 0;
  origin.what = sVar2.what;
  effect_do(effect_00,origin,(object *)0x0,&local_29,aware,local_30,L'\0',L'\0',
            (command_conflict *)0x0);
  *(undefined8 *)(*(long *)(*(long *)&effect->y + 0x28) + 0x100) =
       *(undefined8 *)(*(long *)&effect->y + 0x100);
  disturb(player);
  local_41 = 0;
  if (!aware) {
    local_41 = local_29;
  }
  return (_Bool)(local_41 & 1);
}

Assistant:

bool do_curse_effect(int i, struct object *obj)
{
	struct curse *curse = &curses[i];
	struct effect *effect = curse->obj->effect;
	bool ident = false;
	bool was_aware = player_knows_curse(player, i);
	int dir = randint1(8);

	if (dir > 4) {
		dir++;
	}
	if (curse->obj->effect_msg) {
		msgt(MSG_GENERIC, "%s", curse->obj->effect_msg);
	}
	effect_do(effect, source_object(obj), NULL, &ident, was_aware, dir, 0, 0, NULL);
	curse->obj->known->effect = curse->obj->effect;
	disturb(player);
	return !was_aware && ident;
}